

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O1

set_entry * set_search(set *ht,uint32_t hash,void *key)

{
  uint uVar1;
  uint32_t *puVar2;
  bool bVar3;
  _Bool _Var4;
  uint uVar5;
  uint32_t b0;
  set_entry *psVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  set_entry *psVar12;
  
  if ((key != (void *)0x0) && ((uint32_t *)key != &deleted_key_value)) {
    uVar1 = ht->size;
    uVar8 = ht->size_magic * (ulong)hash;
    uVar7 = (uint)((uVar8 >> 0x20) * (ulong)uVar1 + ((uVar8 & 0xffffffff) * (ulong)uVar1 >> 0x20) >>
                  0x20);
    if (hash % uVar1 == uVar7) {
      uVar10 = (ulong)ht->rehash;
      uVar8 = (ulong)hash * ht->rehash_magic;
      psVar6 = (set_entry *)((ulong)hash % uVar10);
      iVar11 = (int)((uVar8 >> 0x20) * uVar10 + ((uVar8 & 0xffffffff) * uVar10 >> 0x20) >> 0x20);
      if ((int)psVar6 == iVar11) {
        uVar9 = uVar7;
        while( true ) {
          puVar2 = (uint32_t *)ht->table[uVar9].key;
          if (puVar2 == (uint32_t *)0x0) {
            psVar6 = (set_entry *)0x0;
            bVar3 = false;
          }
          else if (((puVar2 == &deleted_key_value) ||
                   (psVar12 = ht->table + uVar9, psVar12->hash != hash)) ||
                  (_Var4 = (*ht->key_equals_function)(key,puVar2), !_Var4)) {
            uVar9 = uVar9 + iVar11 + 1;
            uVar5 = uVar1;
            if (uVar9 < uVar1) {
              uVar5 = 0;
            }
            uVar9 = uVar9 - uVar5;
            bVar3 = true;
          }
          else {
            bVar3 = false;
            psVar6 = psVar12;
          }
          if (!bVar3) break;
          if (uVar9 == uVar7) {
            return (set_entry *)0x0;
          }
        }
        return psVar6;
      }
    }
    __assert_fail("result == n % d",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/fast_urem_by_const.h"
                  ,0x47,"uint32_t util_fast_urem32(uint32_t, uint32_t, uint64_t)");
  }
  __assert_fail("!key_pointer_is_reserved(key)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/set.c"
                ,0xdf,"struct set_entry *set_search(const struct set *, uint32_t, const void *)");
}

Assistant:

static struct set_entry *
set_search(const struct set *ht, uint32_t hash, const void *key)
{
   assert(!key_pointer_is_reserved(key));

   uint32_t size = ht->size;
   uint32_t start_address = util_fast_urem32(hash, size, ht->size_magic);
   uint32_t double_hash = util_fast_urem32(hash, ht->rehash,
                                           ht->rehash_magic) + 1;
   uint32_t hash_address = start_address;
   do {
      struct set_entry *entry = ht->table + hash_address;

      if (entry_is_free(entry)) {
         return NULL;
      } else if (entry_is_present(entry) && entry->hash == hash) {
         if (ht->key_equals_function(key, entry->key)) {
            return entry;
         }
      }

      hash_address += double_hash;
      if (hash_address >= size)
         hash_address -= size;
   } while (hash_address != start_address);

   return NULL;
}